

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::set_source_buf(CTcTokenizer *this,char *buf,size_t len)

{
  CTcSrcObject *src_00;
  CTcTokStream *this_00;
  char *in_RDX;
  CTcSrcMemory *in_RSI;
  CTcTokenizer *in_RDI;
  CTcSrcMemory *src;
  CTcTokString *in_stack_ffffffffffffffc8;
  CTcTokenizer *in_stack_ffffffffffffffd0;
  CCharmapToUni *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  clear_linebuf(in_RDI);
  *(byte *)in_RDI = *(byte *)in_RDI & 0xdf;
  in_RDI->last_linenum_ = 0;
  CTcTokString::clear_text(&in_RDI->unsplicebuf_);
  in_RDI->in_quote_ = L'\0';
  in_RDI->in_triple_ = 0;
  tok_embed_ctx::reset(&in_RDI->comment_in_embedding_);
  tok_embed_ctx::reset(&in_RDI->macro_in_embedding_);
  tok_embed_ctx::reset(&in_RDI->main_in_embedding_);
  in_RDI->if_sp_ = 0;
  in_RDI->if_false_level_ = 0;
  in_RDI->unget_cur_ = (CTcTokenEle *)0x0;
  start_new_line(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int)((ulong)in_RDI >> 0x20));
  src_00 = (CTcSrcObject *)operator_new(0x18);
  CTcSrcMemory::CTcSrcMemory(in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = (CTcTokStream *)operator_new(0x30);
  CTcTokStream::CTcTokStream
            (this_00,(CTcTokFileDesc *)0x0,src_00,(CTcTokStream *)0x0,0,in_RDI->if_sp_);
  in_RDI->str_ = this_00;
  return;
}

Assistant:

void CTcTokenizer::set_source_buf(const char *buf, size_t len)
{
    CTcSrcMemory *src;

    /* empty out the input line buffer */
    clear_linebuf();

    /* reset the scanning state to the start of a brand new stream */
    in_pp_expr_ = FALSE;
    last_linenum_ = 0;
    unsplicebuf_.clear_text();
    in_quote_ = '\0';
    in_triple_ = FALSE;
    comment_in_embedding_.reset();
    macro_in_embedding_.reset();
    main_in_embedding_.reset();
    if_sp_ = 0;
    if_false_level_ = 0;
    unget_cur_ = 0;

    /* set up at the beginning of the input line buffer */
    start_new_line(&linebuf_, 0);

    /* create a reader for the memory buffer */
    src = new CTcSrcMemory(buf, len, default_mapper_);

    /* 
     *   Create a stream to read the source file.  The new stream has no
     *   parent, because this is the top-level source file, and was not
     *   included from any other file.  
     */
    str_ = new CTcTokStream(0, src, 0, 0, if_sp_);
}